

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

void __thiscall
rcg::Buffer::setNodemap(Buffer *this,shared_ptr<GenApi_3_4::CNodeMapRef> *_nodemap,string *tltype)

{
  bool bVar1;
  CChunkAdapterGEV *this_00;
  CChunkAdapterU3V *this_01;
  CChunkAdapterGeneric *this_02;
  element_type *peVar2;
  bool in_stack_00000136;
  bool in_stack_00000137;
  char *in_stack_00000138;
  shared_ptr<GenApi_3_4::CNodeMapRef> *in_stack_00000140;
  CChunkAdapterGeneric *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  CChunkAdapterGeneric *this_03;
  __shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff80;
  
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::operator=
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_ffffffffffffff70,
             (shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_ffffffffffffff68);
  std::__shared_ptr<GenApi_3_4::CChunkAdapter,_(__gnu_cxx::_Lock_policy)2>::reset
            (in_stack_ffffffffffffff80);
  bVar1 = std::operator!=((shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff68);
  if ((bVar1) &&
     (bVar1 = getBoolean(in_stack_00000140,in_stack_00000138,in_stack_00000137,in_stack_00000136),
     bVar1)) {
    bVar1 = std::operator==(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    if (bVar1) {
      this_00 = (CChunkAdapterGEV *)operator_new(0x18);
      peVar2 = std::
               __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x126f3f);
      GenApi_3_4::CChunkAdapterGEV::CChunkAdapterGEV
                (this_00,(peVar2->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,-1)
      ;
      std::shared_ptr<GenApi_3_4::CChunkAdapter>::shared_ptr<GenApi_3_4::CChunkAdapterGEV,void>
                ((shared_ptr<GenApi_3_4::CChunkAdapter> *)in_stack_ffffffffffffff70,
                 (CChunkAdapterGEV *)in_stack_ffffffffffffff68);
      std::shared_ptr<GenApi_3_4::CChunkAdapter>::operator=
                ((shared_ptr<GenApi_3_4::CChunkAdapter> *)in_stack_ffffffffffffff70,
                 (shared_ptr<GenApi_3_4::CChunkAdapter> *)in_stack_ffffffffffffff68);
      std::shared_ptr<GenApi_3_4::CChunkAdapter>::~shared_ptr
                ((shared_ptr<GenApi_3_4::CChunkAdapter> *)0x126f82);
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
      if (bVar1) {
        this_01 = (CChunkAdapterU3V *)operator_new(0x18);
        peVar2 = std::
                 __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x126fe3);
        GenApi_3_4::CChunkAdapterU3V::CChunkAdapterU3V
                  (this_01,(peVar2->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,
                   -1);
        std::shared_ptr<GenApi_3_4::CChunkAdapter>::shared_ptr<GenApi_3_4::CChunkAdapterU3V,void>
                  ((shared_ptr<GenApi_3_4::CChunkAdapter> *)in_stack_ffffffffffffff70,
                   (CChunkAdapterU3V *)in_stack_ffffffffffffff68);
        std::shared_ptr<GenApi_3_4::CChunkAdapter>::operator=
                  ((shared_ptr<GenApi_3_4::CChunkAdapter> *)in_stack_ffffffffffffff70,
                   (shared_ptr<GenApi_3_4::CChunkAdapter> *)in_stack_ffffffffffffff68);
        std::shared_ptr<GenApi_3_4::CChunkAdapter>::~shared_ptr
                  ((shared_ptr<GenApi_3_4::CChunkAdapter> *)0x127026);
      }
      else {
        this_02 = (CChunkAdapterGeneric *)operator_new(0x18);
        this_03 = this_02;
        peVar2 = std::
                 __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x12706a);
        GenApi_3_4::CChunkAdapterGeneric::CChunkAdapterGeneric
                  (this_02,(peVar2->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,
                   -1);
        std::shared_ptr<GenApi_3_4::CChunkAdapter>::
        shared_ptr<GenApi_3_4::CChunkAdapterGeneric,void>
                  ((shared_ptr<GenApi_3_4::CChunkAdapter> *)this_03,in_stack_ffffffffffffff68);
        std::shared_ptr<GenApi_3_4::CChunkAdapter>::operator=
                  ((shared_ptr<GenApi_3_4::CChunkAdapter> *)this_03,
                   (shared_ptr<GenApi_3_4::CChunkAdapter> *)in_stack_ffffffffffffff68);
        std::shared_ptr<GenApi_3_4::CChunkAdapter>::~shared_ptr
                  ((shared_ptr<GenApi_3_4::CChunkAdapter> *)0x1270ad);
      }
    }
  }
  return;
}

Assistant:

void Buffer::setNodemap(const std::shared_ptr<GenApi::CNodeMapRef> _nodemap, const std::string &tltype)
{
  nodemap=_nodemap;
  chunkadapter.reset();

  if (nodemap != 0)
  {
    if (getBoolean(nodemap, "ChunkModeActive", false))
    {
      if (tltype == "GEV")
      {
        chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterGEV(nodemap->_Ptr));
      }
      else if (tltype == "U3V")
      {
        chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterU3V(nodemap->_Ptr));
      }
      else
      {
        chunkadapter=std::shared_ptr<GenApi::CChunkAdapter>(new GenApi::CChunkAdapterGeneric(nodemap->_Ptr));
      }
    }
  }
}